

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O0

void nn_fsm_stopped(nn_fsm *self,int type)

{
  undefined4 in_ESI;
  long in_RDI;
  nn_fsm_event *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x10) != 3) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x10),
            "NN_FSM_STATE_STOPPING",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/fsm.c"
            ,0x92);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_raise((nn_fsm *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,0);
  *(undefined4 *)(in_RDI + 0x10) = 1;
  return;
}

Assistant:

void nn_fsm_stopped (struct nn_fsm *self, int type)
{
    nn_assert_state (self, NN_FSM_STATE_STOPPING);
    nn_fsm_raise (self, &self->stopped, type);
    self->state = NN_FSM_STATE_IDLE;
}